

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_ChatLogging.cpp
# Opt level: O2

void __thiscall
RenX_ChatLogPlugin::WriteToLog
          (RenX_ChatLogPlugin *this,Server *server,PlayerInfo *player,string_view message,
          string *in_prefix)

{
  char cVar1;
  ushort uVar2;
  string *psVar3;
  char *pcVar4;
  ostream *poVar5;
  
  PrepFile(this);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 != '\0') {
    psVar3 = (string *)RenX::Server::getSocketHostname_abi_cxx11_();
    uVar2 = RenX::Server::getSocketPort();
    pcVar4 = (char *)getTimeFormat("%T");
    poVar5 = std::operator<<((ostream *)&this->field_0xd0,pcVar4);
    poVar5 = std::operator<<(poVar5," ");
    poVar5 = std::operator<<(poVar5,psVar3);
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,uVar2);
    poVar5 = std::operator<<(poVar5," ");
    poVar5 = std::operator<<(poVar5,(string *)in_prefix);
    poVar5 = std::operator<<(poVar5," ");
    poVar5 = std::operator<<(poVar5,(string *)&player->name);
    poVar5 = std::operator<<(poVar5,": ");
    std::ostream::write((char *)poVar5,(long)message._M_str);
    std::endl<char,std::char_traits<char>>(poVar5);
    return;
  }
  return;
}

Assistant:

void RenX_ChatLogPlugin::WriteToLog(RenX::Server& server, const RenX::PlayerInfo& player, std::string_view  message, std::string in_prefix)
{
	// Check if new file needs to be opened
	PrepFile();

	if (!fs.is_open()) {
		return;
	}

	const std::string& serverHostname = server.getSocketHostname();
	unsigned short serverPort = server.getSocketPort();

	fs << getTimeFormat("%T")
		<< " "
		<< serverHostname
		<< ":"
		<< serverPort
		<< " "
		<< in_prefix
		<< " "
		<< player.name
		<< ": "
		<< message
		<< std::endl;
}